

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O1

ostream * __thiscall amrex::BoxArray::writeOn(BoxArray *this,ostream *os)

{
  long *plVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int aiVar7 [3];
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ostream *poVar12;
  int dir_1;
  uint uVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  IntVect IVar20;
  Box result;
  Box bx;
  char local_99;
  undefined8 local_98;
  uint uStack_90;
  uint auStack_8c [2];
  undefined8 uStack_84;
  Box local_78;
  element_type *local_50;
  int local_48 [3];
  ostream *local_38;
  
  local_78.smallend.vect[0]._0_1_ = 0x28;
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_78,1);
  poVar12 = std::ostream::_M_insert<long>((long)poVar12);
  local_78.smallend.vect[0]._0_1_ = 0x20;
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)&local_78,1);
  uVar18 = 0;
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,0);
  local_78.smallend.vect[0]._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)&local_78,1);
  local_50 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar19 = (int)((long)*(pointer *)
                        ((long)&(local_50->m_abox).
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data + 8) -
                 *(long *)&(local_50->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data >> 2) * -0x49249249;
  switch((this->m_bat).m_bat_type) {
  case null:
    if (0 < (int)uVar19) {
      uVar16 = (ulong)(uVar19 & 0x7fffffff);
      lVar14 = 0;
      do {
        poVar12 = amrex::operator<<(os,(Box *)(*(long *)&(local_50->m_abox).
                                                                                                                  
                                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                                                  .
                                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                                  ._M_impl.super__Vector_impl_data + lVar14));
        local_78.smallend.vect[0]._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)&local_78,1);
        lVar14 = lVar14 + 0x1c;
        uVar16 = uVar16 - 1;
      } while (uVar16 != 0);
    }
    goto LAB_00564a3c;
  case indexType:
  case indexType_coarsenRatio:
    uVar18 = *(uint *)&(this->m_bat).m_op;
    break;
  case coarsenRatio:
    break;
  case bndryReg:
    if (0 < (int)uVar19) {
      uVar16 = (ulong)(uVar19 & 0x7fffffff);
      lVar14 = 0;
      do {
        BATbndryReg::operator()
                  (&local_78,&(this->m_bat).m_op.m_bndryReg,
                   (Box *)(*(long *)&(local_50->m_abox).
                                     super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                     _M_impl.super__Vector_impl_data + lVar14));
        poVar12 = amrex::operator<<(os,&local_78);
        local_98 = CONCAT71(local_98._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)&local_98,1);
        lVar14 = lVar14 + 0x1c;
        uVar16 = uVar16 - 1;
      } while (uVar16 != 0);
    }
    goto LAB_00564a3c;
  default:
    uVar18 = *(uint *)((long)&(this->m_bat).m_op + 4);
  }
  local_38 = os;
  IVar20 = BATransformer::coarsen_ratio(&this->m_bat);
  iVar15 = IVar20.vect[2];
  local_48[0] = IVar20.vect[0];
  local_48[1] = IVar20.vect[1];
  local_48[2] = IVar20.vect[2];
  aiVar7 = local_48;
  os = local_38;
  if (0 < (int)uVar19) {
    local_48[0] = IVar20.vect[0];
    iVar6 = local_48[0];
    local_48[1] = IVar20.vect[1];
    iVar8 = local_48[1];
    bVar2 = local_48[1] != 1;
    bVar3 = local_48[0] != 1;
    uVar16 = 0;
    local_48 = aiVar7;
    do {
      lVar14 = *(long *)&(local_50->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                         super__Vector_impl_data;
      plVar1 = (long *)(lVar14 + uVar16 * 0x1c);
      lVar17 = *plVar1;
      lVar4 = plVar1[1];
      plVar1 = (long *)(lVar14 + 0xc + uVar16 * 0x1c);
      lVar14 = *plVar1;
      lVar5 = plVar1[1];
      auStack_8c[1] = (uint)((ulong)lVar14 >> 0x20);
      uStack_84 = lVar5;
      uStack_90 = (uint)lVar4;
      auStack_8c[0] = (uint)((ulong)lVar4 >> 0x20);
      local_98 = lVar17;
      if (iVar15 != 1 || (bVar2 || bVar3)) {
        local_98._0_4_ = (uint)lVar17;
        if (iVar6 != 1) {
          if (iVar6 == 4) {
            if ((int)(uint)local_98 < 0) {
              local_98._0_4_ = (uint)local_98 + 1;
              uVar11 = -(uint)local_98;
              if (0 < (int)(uint)local_98) {
                uVar11 = (uint)local_98;
              }
              uVar11 = uVar11 >> 2;
LAB_005645ca:
              local_98._0_4_ = ~uVar11;
            }
            else {
              local_98._0_4_ = (uint)local_98 >> 2;
            }
          }
          else if (iVar6 == 2) {
            if ((int)(uint)local_98 < 0) {
              local_98._0_4_ = (uint)local_98 + 1;
              uVar11 = -(uint)local_98;
              if (0 < (int)(uint)local_98) {
                uVar11 = (uint)local_98;
              }
              uVar11 = uVar11 >> 1;
              goto LAB_005645ca;
            }
            local_98._0_4_ = (uint)local_98 >> 1;
          }
          else if ((int)(uint)local_98 < 0) {
            iVar10 = (uint)local_98 + 1;
            iVar9 = -iVar10;
            if (0 < iVar10) {
              iVar9 = iVar10;
            }
            local_98._0_4_ = ~(iVar9 / iVar6);
          }
          else {
            local_98._0_4_ = (int)(uint)local_98 / iVar6;
          }
        }
        local_98._4_4_ = (uint)((ulong)lVar17 >> 0x20);
        if (iVar8 != 1) {
          if (iVar8 == 4) {
            if (lVar17 < 0) {
              local_98._4_4_ = local_98._4_4_ + 1;
              uVar11 = -local_98._4_4_;
              if (0 < (int)local_98._4_4_) {
                uVar11 = local_98._4_4_;
              }
              uVar11 = uVar11 >> 2;
LAB_0056462f:
              local_98._4_4_ = ~uVar11;
            }
            else {
              local_98._4_4_ = local_98._4_4_ >> 2;
            }
          }
          else if (iVar8 == 2) {
            if (lVar17 < 0) {
              local_98._4_4_ = local_98._4_4_ + 1;
              uVar11 = -local_98._4_4_;
              if (0 < (int)local_98._4_4_) {
                uVar11 = local_98._4_4_;
              }
              uVar11 = uVar11 >> 1;
              goto LAB_0056462f;
            }
            local_98._4_4_ = local_98._4_4_ >> 1;
          }
          else if (lVar17 < 0) {
            iVar10 = local_98._4_4_ + 1;
            iVar9 = -iVar10;
            if (0 < iVar10) {
              iVar9 = iVar10;
            }
            local_98._4_4_ = ~(iVar9 / iVar8);
          }
          else {
            local_98._4_4_ = (int)local_98._4_4_ / iVar8;
          }
        }
        if (iVar15 != 1) {
          if (iVar15 == 4) {
            if ((int)uStack_90 < 0) {
              uStack_90 = uStack_90 + 1;
              uVar11 = -uStack_90;
              if (0 < (int)uStack_90) {
                uVar11 = uStack_90;
              }
              uVar11 = uVar11 >> 2;
LAB_00564690:
              uStack_90 = ~uVar11;
            }
            else {
              uStack_90 = uStack_90 >> 2;
            }
          }
          else if (iVar15 == 2) {
            if ((int)uStack_90 < 0) {
              uStack_90 = uStack_90 + 1;
              uVar11 = -uStack_90;
              if (0 < (int)uStack_90) {
                uVar11 = uStack_90;
              }
              uVar11 = uVar11 >> 1;
              goto LAB_00564690;
            }
            uStack_90 = uStack_90 >> 1;
          }
          else if ((int)uStack_90 < 0) {
            iVar10 = uStack_90 + 1;
            iVar9 = -iVar10;
            if (0 < iVar10) {
              iVar9 = iVar10;
            }
            uStack_90 = ~(iVar9 / iVar15);
          }
          else {
            uStack_90 = (int)uStack_90 / iVar15;
          }
        }
        uStack_84._4_4_ = (uint)((ulong)lVar5 >> 0x20);
        uStack_84._0_4_ = (uint)lVar5;
        if (uStack_84._4_4_ == 0) {
          if (iVar6 != 1) {
            if (iVar6 == 4) {
              if (lVar4 < 0) {
                auStack_8c[0] = auStack_8c[0] + 1;
                uVar11 = -auStack_8c[0];
                if (0 < (int)auStack_8c[0]) {
                  uVar11 = auStack_8c[0];
                }
                uVar11 = uVar11 >> 2;
LAB_00564946:
                auStack_8c[0] = ~uVar11;
              }
              else {
                auStack_8c[0] = auStack_8c[0] >> 2;
              }
            }
            else if (iVar6 == 2) {
              if (lVar4 < 0) {
                auStack_8c[0] = auStack_8c[0] + 1;
                uVar11 = -auStack_8c[0];
                if (0 < (int)auStack_8c[0]) {
                  uVar11 = auStack_8c[0];
                }
                uVar11 = uVar11 >> 1;
                goto LAB_00564946;
              }
              auStack_8c[0] = auStack_8c[0] >> 1;
            }
            else if (lVar4 < 0) {
              iVar10 = auStack_8c[0] + 1;
              iVar9 = -iVar10;
              if (0 < iVar10) {
                iVar9 = iVar10;
              }
              auStack_8c[0] = ~(iVar9 / iVar6);
            }
            else {
              auStack_8c[0] = (int)auStack_8c[0] / iVar6;
            }
          }
          if (iVar8 != 1) {
            if (iVar8 == 4) {
              if (lVar14 < 0) {
                auStack_8c[1] = auStack_8c[1] + 1;
                uVar11 = -auStack_8c[1];
                if (0 < (int)auStack_8c[1]) {
                  uVar11 = auStack_8c[1];
                }
                uVar11 = uVar11 >> 2;
LAB_005649ab:
                auStack_8c[1] = ~uVar11;
              }
              else {
                auStack_8c[1] = auStack_8c[1] >> 2;
              }
            }
            else if (iVar8 == 2) {
              if (lVar14 < 0) {
                auStack_8c[1] = auStack_8c[1] + 1;
                uVar11 = -auStack_8c[1];
                if (0 < (int)auStack_8c[1]) {
                  uVar11 = auStack_8c[1];
                }
                uVar11 = uVar11 >> 1;
                goto LAB_005649ab;
              }
              auStack_8c[1] = auStack_8c[1] >> 1;
            }
            else if (lVar14 < 0) {
              iVar10 = auStack_8c[1] + 1;
              iVar9 = -iVar10;
              if (0 < iVar10) {
                iVar9 = iVar10;
              }
              auStack_8c[1] = ~(iVar9 / iVar8);
            }
            else {
              auStack_8c[1] = (int)auStack_8c[1] / iVar8;
            }
          }
          if (iVar15 != 1) {
            if (iVar15 == 4) {
              if ((int)(uint)uStack_84 < 0) {
                uStack_84._0_4_ = (uint)uStack_84 + 1;
                uVar11 = -(uint)uStack_84;
                if (0 < (int)(uint)uStack_84) {
                  uVar11 = (uint)uStack_84;
                }
                uVar11 = uVar11 >> 2;
LAB_00564a19:
                uStack_84._0_4_ = ~uVar11;
              }
              else {
                uStack_84._0_4_ = (uint)uStack_84 >> 2;
              }
            }
            else if (iVar15 == 2) {
              if ((int)(uint)uStack_84 < 0) {
                uStack_84._0_4_ = (uint)uStack_84 + 1;
                uVar11 = -(uint)uStack_84;
                if (0 < (int)(uint)uStack_84) {
                  uVar11 = (uint)uStack_84;
                }
                uVar11 = uVar11 >> 1;
                goto LAB_00564a19;
              }
              uStack_84._0_4_ = (uint)uStack_84 >> 1;
            }
            else if ((int)(uint)uStack_84 < 0) {
              iVar10 = (uint)uStack_84 + 1;
              iVar9 = -iVar10;
              if (0 < iVar10) {
                iVar9 = iVar10;
              }
              uStack_84._0_4_ = ~(iVar9 / iVar15);
            }
            else {
              uStack_84._0_4_ = (int)(uint)uStack_84 / iVar15;
            }
          }
        }
        else {
          local_78.smallend.vect[0] = 0;
          local_78.smallend.vect[1] = 0;
          local_78.smallend.vect[2] = 0;
          lVar17 = 0;
          do {
            if (((uStack_84._4_4_ >> ((uint)lVar17 & 0x1f) & 1) != 0) &&
               ((int)auStack_8c[lVar17] % local_48[lVar17] != 0)) {
              local_78.smallend.vect[lVar17] = 1;
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
          if (iVar6 != 1) {
            if (iVar6 == 4) {
              if (lVar4 < 0) {
                auStack_8c[0] = auStack_8c[0] + 1;
                uVar11 = -auStack_8c[0];
                if (0 < (int)auStack_8c[0]) {
                  uVar11 = auStack_8c[0];
                }
                uVar11 = uVar11 >> 2;
LAB_00564785:
                auStack_8c[0] = ~uVar11;
              }
              else {
                auStack_8c[0] = auStack_8c[0] >> 2;
              }
            }
            else if (iVar6 == 2) {
              if (lVar4 < 0) {
                auStack_8c[0] = auStack_8c[0] + 1;
                uVar11 = -auStack_8c[0];
                if (0 < (int)auStack_8c[0]) {
                  uVar11 = auStack_8c[0];
                }
                uVar11 = uVar11 >> 1;
                goto LAB_00564785;
              }
              auStack_8c[0] = auStack_8c[0] >> 1;
            }
            else if (lVar4 < 0) {
              iVar10 = auStack_8c[0] + 1;
              iVar9 = -iVar10;
              if (0 < iVar10) {
                iVar9 = iVar10;
              }
              auStack_8c[0] = ~(iVar9 / iVar6);
            }
            else {
              auStack_8c[0] = (int)auStack_8c[0] / iVar6;
            }
          }
          if (iVar8 != 1) {
            if (iVar8 == 4) {
              if (lVar14 < 0) {
                auStack_8c[1] = auStack_8c[1] + 1;
                uVar11 = -auStack_8c[1];
                if (0 < (int)auStack_8c[1]) {
                  uVar11 = auStack_8c[1];
                }
                uVar11 = uVar11 >> 2;
LAB_005647ec:
                auStack_8c[1] = ~uVar11;
              }
              else {
                auStack_8c[1] = auStack_8c[1] >> 2;
              }
            }
            else if (iVar8 == 2) {
              if (lVar14 < 0) {
                auStack_8c[1] = auStack_8c[1] + 1;
                uVar11 = -auStack_8c[1];
                if (0 < (int)auStack_8c[1]) {
                  uVar11 = auStack_8c[1];
                }
                uVar11 = uVar11 >> 1;
                goto LAB_005647ec;
              }
              auStack_8c[1] = auStack_8c[1] >> 1;
            }
            else if (lVar14 < 0) {
              iVar10 = auStack_8c[1] + 1;
              iVar9 = -iVar10;
              if (0 < iVar10) {
                iVar9 = iVar10;
              }
              auStack_8c[1] = ~(iVar9 / iVar8);
            }
            else {
              auStack_8c[1] = (int)auStack_8c[1] / iVar8;
            }
          }
          if (iVar15 != 1) {
            if (iVar15 == 4) {
              if ((int)(uint)uStack_84 < 0) {
                uStack_84._0_4_ = (uint)uStack_84 + 1;
                uVar11 = -(uint)uStack_84;
                if (0 < (int)(uint)uStack_84) {
                  uVar11 = (uint)uStack_84;
                }
                uVar11 = uVar11 >> 2;
LAB_0056484d:
                uStack_84._0_4_ = ~uVar11;
              }
              else {
                uStack_84._0_4_ = (uint)uStack_84 >> 2;
              }
            }
            else if (iVar15 == 2) {
              if ((int)(uint)uStack_84 < 0) {
                uStack_84._0_4_ = (uint)uStack_84 + 1;
                uVar11 = -(uint)uStack_84;
                if (0 < (int)(uint)uStack_84) {
                  uVar11 = (uint)uStack_84;
                }
                uVar11 = uVar11 >> 1;
                goto LAB_0056484d;
              }
              uStack_84._0_4_ = (uint)uStack_84 >> 1;
            }
            else if ((int)(uint)uStack_84 < 0) {
              iVar10 = (uint)uStack_84 + 1;
              iVar9 = -iVar10;
              if (0 < iVar10) {
                iVar9 = iVar10;
              }
              uStack_84._0_4_ = ~(iVar9 / iVar15);
            }
            else {
              uStack_84._0_4_ = (int)(uint)uStack_84 / iVar15;
            }
          }
          auStack_8c[0] = auStack_8c[0] + local_78.smallend.vect[0];
          auStack_8c[1] = auStack_8c[1] + local_78.smallend.vect[1];
          uStack_84._0_4_ = (uint)uStack_84 + local_78.smallend.vect[2];
        }
      }
      local_78.bigend.vect[1] = auStack_8c[1];
      local_78.bigend.vect[2] = (uint)uStack_84;
      local_78.btype.itype = uStack_84._4_4_;
      local_78.smallend.vect[0] = (uint)local_98;
      local_78.smallend.vect[1] = local_98._4_4_;
      local_78.smallend.vect[2] = uStack_90;
      local_78.bigend.vect[0] = auStack_8c[0];
      lVar14 = 0;
      do {
        uVar11 = 1 << ((byte)lVar14 & 0x1f);
        uVar13 = (uint)lVar14;
        local_78.bigend.vect[lVar14] =
             (local_78.bigend.vect[lVar14] + (uint)((uVar18 >> (uVar13 & 0x1f) & 1) != 0)) -
             (uint)((local_78.btype.itype >> (uVar13 & 0x1f) & 1) != 0);
        if ((uVar18 >> (uVar13 & 0x1f) & 1) == 0) {
          local_78.btype.itype = ~uVar11 & local_78.btype.itype;
        }
        else {
          local_78.btype.itype = uVar11 | local_78.btype.itype;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 3);
      poVar12 = amrex::operator<<(local_38,&local_78);
      local_99 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,&local_99,1);
      uVar16 = uVar16 + 1;
      os = local_38;
    } while (uVar16 != (uVar19 & 0x7fffffff));
  }
LAB_00564a3c:
  local_78.smallend.vect[0]._0_1_ = 0x29;
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_78,1);
  if (((byte)os[*(long *)(*(long *)os + -0x18) + 0x20] & 5) != 0) {
    Error_host("BoxArray::writeOn(ostream&) failed");
  }
  return os;
}

Assistant:

std::ostream&
BoxArray::writeOn (std::ostream& os) const
{
    //
    // TODO -- completely remove the fiction of a hash value.
    //
    os << '(' << size() << ' ' << 0 << '\n';

    const int N = size();
    auto const& bxs = this->m_ref->m_abox;
    if (m_bat.is_null()) {
        for (int i = 0; i < N; ++i) {
            os << bxs[i] << '\n';
        }
    } else if (m_bat.is_simple()) {
        IndexType t = ixType();
        IntVect cr = crseRatio();
        for (int i = 0; i < N; ++i) {
            os << amrex::convert(amrex::coarsen(bxs[i],cr),t) << '\n';
        }
    } else {
        for (int i = 0; i < N; ++i) {
            os << m_bat.m_op.m_bndryReg(bxs[i]) << '\n';
        }
    }

    os << ')';

    if (os.fail())
        amrex::Error("BoxArray::writeOn(ostream&) failed");

    return os;
}